

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,false>
               (void)

{
  datatype dt;
  datatype local_20;
  
  local_20._vptr_datatype = (_func_int **)&PTR__datatype_0015b1e8;
  local_20.mpitype = (MPI_Datatype)&ompi_mpi_int;
  local_20.builtin = true;
  samplesort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,false>
            ();
  datatype::~datatype(&local_20);
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // get MPI type
    mxx::datatype dt = mxx::get_datatype<value_type>();
    MPI_Datatype mpi_dt = dt.type();

    // sort
    impl::samplesort<_Iterator, _Compare, _Stable>(begin, end, comp, mpi_dt, comm);
}